

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O1

Expression *
slang::ast::MemberAccessExpression::fromSelector
          (Compilation *compilation,Expression *expr,MemberSelector *selector,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context,bool isFromLookupChain)

{
  uint uVar1;
  SourceRange *pSVar2;
  SymbolKind SVar3;
  size_t sVar4;
  int *piVar5;
  size_t __n;
  SourceRange range_00;
  optional<slang::SourceRange> sourceRange;
  optional<slang::SourceRange> sourceRange_00;
  int iVar6;
  FieldSymbol *args_2;
  MemberAccessExpression *pMVar7;
  Type *pTVar8;
  Type *this;
  Symbol *pSVar9;
  Expression *pEVar10;
  Diagnostic *pDVar11;
  SourceLocation SVar12;
  ClassType *ct;
  Expression *unaff_R14;
  bool bVar14;
  SourceRange range_01;
  string_view methodName;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange range;
  anon_class_16_2_15dbab97 errorIfNotProcedural;
  anon_class_16_2_15dbab97 errorIfAssertion;
  undefined1 in_stack_ffffffffffffff00;
  ASTContext *in_stack_ffffffffffffff08;
  ASTContext *context_00;
  SourceRange local_e0;
  Type *local_d0;
  anon_class_16_2_15dbab97 local_c8;
  anon_class_16_2_15dbab97 local_b8;
  SourceLocation local_a8;
  SourceLocation SStack_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  SourceLocation local_88;
  SourceLocation SStack_80;
  undefined1 local_78;
  undefined7 uStack_77;
  FieldSymbol *local_68;
  undefined1 local_38;
  SourceLocation SVar13;
  
  sVar4 = (selector->name)._M_len;
  if (sVar4 == 0) {
    pEVar10 = Expression::badExpr(compilation,expr);
    return pEVar10;
  }
  local_e0.startLoc = (expr->sourceRange).startLoc;
  local_e0.endLoc = (selector->nameRange).endLoc;
  if (expr->kind == Call) {
    if (isFromLookupChain) {
      sourceRange_02.endLoc = local_e0.endLoc;
      sourceRange_02.startLoc = local_e0.startLoc;
      ASTContext::addDiag(context,(DiagCode)0x390007,sourceRange_02);
    }
  }
  else if (expr->kind == NamedValue) {
    piVar5 = *(int **)(expr + 1);
    bVar14 = true;
    if (((*piVar5 == 0x46) && (__n = *(size_t *)(piVar5 + 0x5a), __n == sVar4)) &&
       ((__n == 0 ||
        (iVar6 = bcmp(*(void **)(piVar5 + 0x5c),(selector->name)._M_str,__n), iVar6 == 0)))) {
      in_stack_ffffffffffffff00 = SUB81(context,0);
      methodName._M_str = (char *)invocation;
      methodName._M_len = (size_t)"index";
      unaff_R14 = CallExpression::fromBuiltInMethod
                            ((CallExpression *)compilation,(Compilation *)0x46,(SymbolKind)expr,
                             (Expression *)0x5,methodName,(InvocationExpressionSyntax *)withClause,
                             (ArrayOrRandomizeMethodExpressionSyntax *)context,
                             in_stack_ffffffffffffff08);
      bVar14 = unaff_R14 == (Expression *)0x0;
    }
    if (!bVar14) {
      return unaff_R14;
    }
  }
  local_c8.range = &local_e0;
  pTVar8 = (expr->type).ptr;
  local_c8.context = context;
  local_b8.context = context;
  local_b8.range = local_c8.range;
  if (pTVar8->canonical == (Type *)0x0) {
    Type::resolveCanonical(pTVar8);
  }
  pTVar8 = pTVar8->canonical;
  switch((pTVar8->super_Symbol).kind) {
  case EnumType:
  case FixedSizeUnpackedArrayType:
  case DynamicArrayType:
  case AssociativeArrayType:
  case QueueType:
  case StringType:
  case EventType:
  case SequenceType:
    pEVar10 = tryBindSpecialMethod(compilation,expr,selector,invocation,withClause,context);
    if (pEVar10 != (Expression *)0x0) {
      return pEVar10;
    }
    pEVar10 = CallExpression::fromSystemMethod
                        (compilation,expr,selector,invocation,withClause,context);
    return pEVar10;
  default:
switchD_0039bf21_caseD_b:
    pEVar10 = tryBindSpecialMethod(compilation,expr,selector,invocation,withClause,context);
    if (pEVar10 != (Expression *)0x0) {
      return pEVar10;
    }
    pDVar11 = ASTContext::addDiag(context,(DiagCode)0x650007,selector->dotLocation);
    Diagnostic::operator<<(pDVar11,expr->sourceRange);
    Diagnostic::operator<<(pDVar11,selector->nameRange);
    ast::operator<<(pDVar11,(expr->type).ptr);
  case ErrorType:
    goto LAB_0039c26c;
  case PackedStructType:
  case UnpackedStructType:
  case PackedUnionType:
  case UnpackedUnionType:
    pTVar8 = (Type *)Symbol::scopeOrNull(&pTVar8->super_Symbol);
    break;
  case ClassType:
    if (*(int *)&pTVar8[1].super_Symbol.nextInScope != 0) {
      Scope::elaborate((Scope *)(pTVar8 + 1));
    }
    this = (Type *)pTVar8[2].super_Symbol.name._M_len;
    bVar14 = true;
    if (this != (Type *)0x0) {
      if (this->canonical == (Type *)0x0) {
        local_d0 = this;
        Type::resolveCanonical(this);
        this = local_d0;
      }
      bVar14 = true;
      if ((this->canonical->super_Symbol).kind == ErrorType) {
        unaff_R14 = Expression::badExpr(compilation,expr);
        bVar14 = false;
      }
    }
    pTVar8 = pTVar8 + 1;
    if (!bVar14) {
      return unaff_R14;
    }
    break;
  case CovergroupType:
    if (*(int *)&pTVar8[1].super_Symbol.nextInScope != 0) {
      Scope::elaborate((Scope *)(pTVar8 + 1));
    }
    pTVar8 = (Type *)&pTVar8[1].super_Symbol.originatingSyntax[2].previewNode;
    break;
  case VoidType:
    pSVar9 = Expression::getSymbolReference(expr,true);
    bVar14 = true;
    if ((pSVar9 == (Symbol *)0x0) || ((pSVar9->kind != CoverCross && (pSVar9->kind != Coverpoint))))
    {
      pTVar8 = (Type *)0x0;
    }
    else {
      pTVar8 = (Type *)(pSVar9 + 1);
      bVar14 = false;
    }
    if (bVar14) goto switchD_0039bf21_caseD_b;
  }
  args_2 = (FieldSymbol *)Scope::find((Scope *)pTVar8,selector->name);
  if (args_2 == (FieldSymbol *)0x0) {
    pEVar10 = tryBindSpecialMethod(compilation,expr,selector,invocation,withClause,context);
    if (pEVar10 != (Expression *)0x0) {
      return pEVar10;
    }
    pDVar11 = ASTContext::addDiag(context,(DiagCode)0x3a000a,(selector->nameRange).startLoc);
    SVar13 = (expr->sourceRange).startLoc;
    SVar12 = (expr->sourceRange).endLoc;
  }
  else {
    SVar3 = (args_2->super_VariableSymbol).super_ValueSymbol.super_Symbol.kind;
    uVar1 = SVar3 - ClassProperty;
    if (uVar1 < 0x20) {
      if ((0xb0000200U >> (uVar1 & 0x1f) & 1) != 0) {
        if ((((local_c8.context)->flags).m_bits & 0x20) == 0) {
          pMVar7 = BumpAllocator::
                   emplace<slang::ast::MemberAccessExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Symbol_const&,slang::SourceRange&>
                             (&compilation->super_BumpAllocator,compilation->voidType,expr,
                              (Symbol *)args_2,&local_e0);
          return &pMVar7->super_Expression;
        }
        ASTContext::addDiag(local_c8.context,(DiagCode)0x4c0007,*local_c8.range);
        goto LAB_0039c26c;
      }
      pSVar2 = &selector->nameRange;
      if (uVar1 == 0) {
        local_88 = pSVar2->startLoc;
        SStack_80 = (selector->nameRange).endLoc;
        local_78 = 1;
        sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_77;
        sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
        sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_payload._9_7_ = SStack_80._1_7_;
        sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_payload._0_9_ = *(unkbyte9 *)pSVar2;
        Lookup::ensureVisible((Symbol *)args_2,context,sourceRange_00);
        if (((args_2->super_VariableSymbol).lifetime != Automatic) ||
           ((bVar14 = fromSelector::anon_class_16_2_15dbab97::operator()(&local_c8), !bVar14 &&
            (bVar14 = fromSelector::anon_class_16_2_15dbab97::operator()(&local_b8), !bVar14)))) {
          pTVar8 = DeclaredType::getType
                             (&(args_2->super_VariableSymbol).super_ValueSymbol.declaredType);
          pMVar7 = BumpAllocator::
                   emplace<slang::ast::MemberAccessExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::ClassPropertySymbol_const&,slang::SourceRange&>
                             (&compilation->super_BumpAllocator,pTVar8,expr,
                              (ClassPropertySymbol *)args_2,&local_e0);
          return &pMVar7->super_Expression;
        }
        goto LAB_0039c26c;
      }
      if (uVar1 == 1) {
        local_a8 = pSVar2->startLoc;
        SStack_a0 = (selector->nameRange).endLoc;
        local_98 = 1;
        context_00 = (ASTContext *)CONCAT71(uStack_97,1);
        sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_payload._9_7_ = SStack_a0._1_7_;
        sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_payload._0_9_ = *(unkbyte9 *)pSVar2;
        sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._16_8_ = context_00;
        Lookup::ensureVisible((Symbol *)args_2,context,sourceRange);
        if (((*(byte *)((long)&(args_2->super_VariableSymbol).super_ValueSymbol.driverMap.field_0 +
                       0x44) & 4) != 0) ||
           ((bVar14 = fromSelector::anon_class_16_2_15dbab97::operator()(&local_c8), !bVar14 &&
            (bVar14 = fromSelector::anon_class_16_2_15dbab97::operator()(&local_b8), !bVar14)))) {
          local_38 = 0;
          range_00.endLoc._0_1_ = local_e0.endLoc._0_1_;
          range_00.startLoc = local_e0.startLoc;
          range_00.endLoc._1_7_ = local_e0.endLoc._1_7_;
          local_68 = args_2;
          pEVar10 = CallExpression::fromLookup
                              ((CallExpression *)compilation,(Compilation *)&stack0xffffffffffffff98
                               ,(Subroutine *)expr,(Expression *)invocation,
                               (InvocationExpressionSyntax *)withClause,
                               (ArrayOrRandomizeMethodExpressionSyntax *)context,range_00,context_00
                              );
          return pEVar10;
        }
        goto LAB_0039c26c;
      }
    }
    if (SVar3 == EnumValue) {
      sourceRange_01.endLoc = (SourceLocation)0x0;
      sourceRange_01.startLoc = local_e0.endLoc;
      pEVar10 = ValueExpressionBase::fromSymbol
                          ((ValueExpressionBase *)context,(ASTContext *)args_2,(Symbol *)0x0,
                           (HierarchicalReference *)local_e0.startLoc,sourceRange_01,false,
                           (bool)in_stack_ffffffffffffff00);
      return pEVar10;
    }
    if (SVar3 == Field) {
      pTVar8 = DeclaredType::getType(&(args_2->super_VariableSymbol).super_ValueSymbol.declaredType)
      ;
      pMVar7 = BumpAllocator::
               emplace<slang::ast::MemberAccessExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::FieldSymbol_const&,slang::SourceRange&>
                         (&compilation->super_BumpAllocator,pTVar8,expr,args_2,&local_e0);
      return &pMVar7->super_Expression;
    }
    bVar14 = Symbol::isValue((Symbol *)args_2);
    if (bVar14) {
      pTVar8 = DeclaredType::getType(&(args_2->super_VariableSymbol).super_ValueSymbol.declaredType)
      ;
      pMVar7 = BumpAllocator::
               emplace<slang::ast::MemberAccessExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::ValueSymbol_const&,slang::SourceRange&>
                         (&compilation->super_BumpAllocator,pTVar8,expr,(ValueSymbol *)args_2,
                          &local_e0);
      return &pMVar7->super_Expression;
    }
    pDVar11 = ASTContext::addDiag(context,(DiagCode)0x630007,selector->dotLocation);
    Diagnostic::operator<<(pDVar11,selector->nameRange);
    SVar13 = (expr->sourceRange).startLoc;
    SVar12 = (expr->sourceRange).endLoc;
  }
  range_01.endLoc = SVar12;
  range_01.startLoc = SVar13;
  Diagnostic::operator<<(pDVar11,range_01);
  Diagnostic::operator<<(pDVar11,selector->name);
  ast::operator<<(pDVar11,(expr->type).ptr);
LAB_0039c26c:
  pEVar10 = Expression::badExpr(compilation,expr);
  return pEVar10;
}

Assistant:

Expression& MemberAccessExpression::fromSelector(
    Compilation& compilation, Expression& expr, const LookupResult::MemberSelector& selector,
    const InvocationExpressionSyntax* invocation,
    const ArrayOrRandomizeMethodExpressionSyntax* withClause, const ASTContext& context,
    bool isFromLookupChain) {

    // If the selector name is invalid just give up early.
    if (selector.name.empty())
        return badExpr(compilation, &expr);

    // The source range of the entire member access starts from the value being selected.
    SourceRange range{expr.sourceRange.start(), selector.nameRange.end()};

    // Special cases for built-in iterator methods that don't cleanly fit the general
    // mold of looking up members via the type of the expression.
    if (expr.kind == ExpressionKind::NamedValue) {
        auto& sym = expr.as<NamedValueExpression>().symbol;
        auto symKind = sym.kind;
        if (symKind == SymbolKind::Iterator) {
            auto& iter = sym.as<IteratorSymbol>();
            if (iter.indexMethodName == selector.name) {
                auto result = CallExpression::fromBuiltInMethod(compilation, symKind, expr,
                                                                "index"sv, invocation, withClause,
                                                                context);
                if (result)
                    return *result;
            }
        }
    }
    else if (expr.kind == ExpressionKind::Call && isFromLookupChain) {
        // It's an error to dot select from a call expression that
        // doesn't include parentheses, which it doesn't iff
        // isFromLookupChain is set.
        context.addDiag(diag::ChainedMethodParens, range);
    }

    auto errorIfNotProcedural = [&] {
        if (context.flags.has(ASTFlags::NonProcedural)) {
            context.addDiag(diag::DynamicNotProcedural, range);
            return true;
        }
        return false;
    };
    auto errorIfAssertion = [&] {
        if (context.flags.has(ASTFlags::AssertionExpr)) {
            context.addDiag(diag::ClassMemberInAssertion, range);
            return true;
        }
        return false;
    };

    // This might look like a member access but actually be a built-in type method.
    const Type& type = expr.type->getCanonicalType();
    const Scope* scope = nullptr;
    switch (type.kind) {
        case SymbolKind::PackedStructType:
        case SymbolKind::UnpackedStructType:
        case SymbolKind::PackedUnionType:
        case SymbolKind::UnpackedUnionType:
            scope = &type.as<Scope>();
            break;
        case SymbolKind::ClassType: {
            auto& ct = type.as<ClassType>();
            if (auto base = ct.getBaseClass(); base && base->isError())
                return badExpr(compilation, &expr);

            scope = &ct;
            break;
        }
        case SymbolKind::CovergroupType:
            scope = &type.as<CovergroupType>().getBody();
            break;
        case SymbolKind::EnumType:
        case SymbolKind::StringType:
        case SymbolKind::FixedSizeUnpackedArrayType:
        case SymbolKind::DynamicArrayType:
        case SymbolKind::AssociativeArrayType:
        case SymbolKind::QueueType:
        case SymbolKind::EventType:
        case SymbolKind::SequenceType: {
            if (auto result = tryBindSpecialMethod(compilation, expr, selector, invocation,
                                                   withClause, context)) {
                return *result;
            }

            return CallExpression::fromSystemMethod(compilation, expr, selector, invocation,
                                                    withClause, context);
        }
        case SymbolKind::ErrorType:
            return badExpr(compilation, &expr);
        case SymbolKind::VoidType:
            if (auto sym = expr.getSymbolReference()) {
                if (sym->kind == SymbolKind::Coverpoint) {
                    scope = &sym->as<CoverpointSymbol>();
                    break;
                }
                else if (sym->kind == SymbolKind::CoverCross) {
                    scope = &sym->as<CoverCrossSymbol>();
                    break;
                }
            }
            [[fallthrough]];
        default: {
            if (auto result = tryBindSpecialMethod(compilation, expr, selector, invocation,
                                                   withClause, context)) {
                return *result;
            }

            auto& diag = context.addDiag(diag::InvalidMemberAccess, selector.dotLocation);
            diag << expr.sourceRange;
            diag << selector.nameRange;
            diag << *expr.type;
            return badExpr(compilation, &expr);
        }
    }

    const Symbol* member = scope->find(selector.name);
    if (!member) {
        if (auto result = tryBindSpecialMethod(compilation, expr, selector, invocation, withClause,
                                               context)) {
            return *result;
        }

        auto& diag = context.addDiag(diag::UnknownMember, selector.nameRange.start());
        diag << expr.sourceRange;
        diag << selector.name;
        diag << *expr.type;
        return badExpr(compilation, &expr);
    }

    switch (member->kind) {
        case SymbolKind::Field: {
            auto& field = member->as<FieldSymbol>();
            return *compilation.emplace<MemberAccessExpression>(field.getType(), expr, field,
                                                                range);
        }
        case SymbolKind::ClassProperty: {
            Lookup::ensureVisible(*member, context, selector.nameRange);
            auto& prop = member->as<ClassPropertySymbol>();
            if (prop.lifetime == VariableLifetime::Automatic &&
                (errorIfNotProcedural() || errorIfAssertion())) {
                return badExpr(compilation, &expr);
            }

            return *compilation.emplace<MemberAccessExpression>(prop.getType(), expr, prop, range);
        }
        case SymbolKind::Subroutine: {
            Lookup::ensureVisible(*member, context, selector.nameRange);
            auto& sub = member->as<SubroutineSymbol>();
            if (!sub.flags.has(MethodFlags::Static) &&
                (errorIfNotProcedural() || errorIfAssertion())) {
                return badExpr(compilation, &expr);
            }

            return CallExpression::fromLookup(compilation, &sub, &expr, invocation, withClause,
                                              range, context);
        }
        case SymbolKind::ConstraintBlock:
        case SymbolKind::Coverpoint:
        case SymbolKind::CoverCross:
        case SymbolKind::CoverageBin: {
            if (errorIfNotProcedural())
                return badExpr(compilation, &expr);
            return *compilation.emplace<MemberAccessExpression>(compilation.getVoidType(), expr,
                                                                *member, range);
        }
        case SymbolKind::EnumValue:
            // The thing being selected from doesn't actually matter, since the
            // enum value is a constant.
            return ValueExpressionBase::fromSymbol(context, *member, nullptr, range);
        default: {
            if (member->isValue()) {
                auto& value = member->as<ValueSymbol>();
                return *compilation.emplace<MemberAccessExpression>(value.getType(), expr, value,
                                                                    range);
            }

            auto& diag = context.addDiag(diag::InvalidClassAccess, selector.dotLocation);
            diag << selector.nameRange;
            diag << expr.sourceRange;
            diag << selector.name;
            diag << *expr.type;
            return badExpr(compilation, &expr);
        }
    }
}